

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointDimensions::test_method(PointDimensions *this)

{
  undefined4 local_2b4;
  undefined **local_2b0;
  undefined1 local_2a8;
  undefined8 *local_2a0;
  char *local_298;
  undefined8 local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  Point p;
  SO3<mnf::ExpMapMatrix> S;
  
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&S);
  mnf::Manifold::createRandomPoint(1.0);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x58);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0013ec90;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_260 = "";
  local_290 = mnf::Point::getDimM();
  local_2b4 = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_2b0,&local_268,0x58,1,2,&local_290,"p.getDimM()",&local_2b4,"3");
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x59);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0013ec90;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_270 = "";
  local_290 = mnf::Point::getTangentDimM();
  local_2b4 = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_2b0,&local_278,0x59,1,2,&local_290,"p.getTangentDimM()",&local_2b4,"3");
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x5a);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0013ec90;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_280 = "";
  local_290 = mnf::Point::getRepresentationDimM();
  local_2b4 = 9;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_2b0,&local_288,0x5a,1,2,&local_290,"p.getRepresentationDimM()",&local_2b4,"9");
  mnf::Point::~Point(&p);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointDimensions)
{
  SO3<ExpMapMatrix> S;
  Point p = S.createRandomPoint();
  BOOST_CHECK_EQUAL(p.getDimM(), 3);
  BOOST_CHECK_EQUAL(p.getTangentDimM(), 3);
  BOOST_CHECK_EQUAL(p.getRepresentationDimM(), 9);
}